

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O3

bool operator==(Quaternion<double> *lhs,Quaternion<double> *rhs)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar3._0_8_ = ABS(rhs->n);
  auVar3._8_8_ = ABS(rhs->ni);
  auVar4._8_8_ = ABS(lhs->ni);
  auVar4._0_8_ = ABS(lhs->n);
  auVar4 = maxpd(auVar3,auVar4);
  auVar5._0_8_ = ABS(rhs->nj);
  auVar5._8_8_ = ABS(rhs->nk);
  auVar6._8_8_ = ABS(lhs->nk);
  auVar6._0_8_ = ABS(lhs->nj);
  auVar6 = maxpd(auVar5,auVar6);
  auVar1._4_4_ = -(uint)(auVar4._8_8_ * 1e-05 < ABS(lhs->ni - rhs->ni));
  auVar1._0_4_ = -(uint)(auVar4._0_8_ * 1e-05 < ABS(lhs->n - rhs->n));
  auVar1._8_4_ = -(uint)(auVar6._0_8_ * 1e-05 < ABS(lhs->nj - rhs->nj));
  auVar1._12_4_ = -(uint)(auVar6._8_8_ * 1e-05 < ABS(lhs->nk - rhs->nk));
  iVar2 = movmskps(in_EAX,auVar1);
  return iVar2 == 0;
}

Assistant:

T a() const {
        return this->n;
    }